

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O3

void __thiscall QMessageBoxPrivate::setupLayout(QMessageBoxPrivate *this)

{
  QWidget *this_00;
  QWidget *widget;
  QMessageBoxDetailsText *widget_00;
  byte bVar1;
  int iVar2;
  int iVar3;
  QLayout *pQVar4;
  QLayoutItem *pQVar5;
  undefined4 uVar6;
  long in_FS_OFFSET;
  int local_5c;
  QPixmap local_50 [24];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  pQVar4 = QWidget::layout(this_00);
  if (pQVar4 != (QLayout *)0x0) {
    (**(code **)(*(long *)pQVar4 + 0x20))(pQVar4);
  }
  pQVar4 = (QLayout *)operator_new(0x20);
  QGridLayout::QGridLayout((QGridLayout *)pQVar4,(QWidget *)0x0);
  QLabel::pixmap((QLabel *)local_50);
  bVar1 = QPixmap::isNull();
  QPixmap::~QPixmap(local_50);
  if (bVar1 == 0) {
    local_5c = 2;
    QGridLayout::addWidget((QGridLayout *)pQVar4,(QWidget *)this->iconLabel,0,0,2,1,(Alignment)0x20)
    ;
    uVar6 = 7;
  }
  else {
    uVar6 = 0xf;
    local_5c = 1;
  }
  (**(code **)(*(long *)&(this->iconLabel->super_QFrame).super_QWidget + 0x68))
            (this->iconLabel,bVar1 ^ 1);
  pQVar5 = (QLayoutItem *)operator_new(0x28);
  (pQVar5->align).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
  super_QFlagsStorage<Qt::AlignmentFlag>.i = 0;
  pQVar5->_vptr_QLayoutItem = (_func_int **)&PTR__QSpacerItem_007e6ea8;
  *(undefined4 *)&pQVar5->field_0xc = uVar6;
  pQVar5[1]._vptr_QLayoutItem = (_func_int **)0x1;
  *(undefined8 *)&pQVar5[1].align = 0;
  pQVar5[2]._vptr_QLayoutItem = (_func_int **)0xffffffffffffffff;
  QGridLayout::addItem((QGridLayout *)pQVar4,pQVar5,0,(uint)(bVar1 ^ 1),2,1,(Alignment)0x0);
  QGridLayout::addWidget((QGridLayout *)pQVar4,(QWidget *)this->label,0,local_5c,1,1,(Alignment)0x0)
  ;
  if ((QWidget *)this->informativeLabel != (QWidget *)0x0) {
    QWidget::setContentsMargins((QWidget *)this->informativeLabel,0,7,0,7);
    QGridLayout::addWidget
              ((QGridLayout *)pQVar4,(QWidget *)this->informativeLabel,1,local_5c,1,1,(Alignment)0x0
              );
  }
  if ((QWidget *)this->checkbox != (QWidget *)0x0) {
    QGridLayout::addWidget
              ((QGridLayout *)pQVar4,(QWidget *)this->checkbox,
               2 - (uint)(this->informativeLabel == (QLabel *)0x0),local_5c,1,1,(Alignment)0x1);
    pQVar5 = (QLayoutItem *)operator_new(0x28);
    pQVar5->_vptr_QLayoutItem = (_func_int **)&PTR__QSpacerItem_007e6ea8;
    *(undefined8 *)&pQVar5->align = 0x100000000;
    pQVar5[1]._vptr_QLayoutItem = (_func_int **)0x7;
    *(undefined8 *)&pQVar5[1].align = 0;
    pQVar5[2]._vptr_QLayoutItem = (_func_int **)0xffffffffffffffff;
    iVar2 = QGridLayout::rowCount((QGridLayout *)pQVar4);
    QGridLayout::addItem((QGridLayout *)pQVar4,pQVar5,iVar2,0,1,1,(Alignment)0x0);
  }
  widget = &this->buttonBox->super_QWidget;
  iVar2 = QGridLayout::rowCount((QGridLayout *)pQVar4);
  iVar3 = QGridLayout::columnCount((QGridLayout *)pQVar4);
  QGridLayout::addWidget((QGridLayout *)pQVar4,widget,iVar2,0,1,iVar3,(Alignment)0x0);
  widget_00 = this->detailsText;
  if (widget_00 != (QMessageBoxDetailsText *)0x0) {
    iVar2 = QGridLayout::rowCount((QGridLayout *)pQVar4);
    iVar3 = QGridLayout::columnCount((QGridLayout *)pQVar4);
    QGridLayout::addWidget
              ((QGridLayout *)pQVar4,&widget_00->super_QWidget,iVar2,0,1,iVar3,(Alignment)0x0);
  }
  QLayout::setSizeConstraint(pQVar4,SetNoConstraint);
  QWidget::setLayout(this_00,pQVar4);
  retranslateStrings(this);
  updateSize(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMessageBoxPrivate::setupLayout()
{
    Q_Q(QMessageBox);
    delete q->layout();
    QGridLayout *grid = new QGridLayout;
    const bool hasIcon = !iconLabel->pixmap().isNull();

    if (hasIcon)
        grid->addWidget(iconLabel, 0, 0, 2, 1, Qt::AlignTop);
    iconLabel->setVisible(hasIcon);
#ifdef Q_OS_MAC
    QSpacerItem *indentSpacer = new QSpacerItem(14, 1, QSizePolicy::Fixed, QSizePolicy::Fixed);
#else
    QSpacerItem *indentSpacer = new QSpacerItem(hasIcon ? 7 : 15, 1, QSizePolicy::Fixed, QSizePolicy::Fixed);
#endif
    grid->addItem(indentSpacer, 0, hasIcon ? 1 : 0, 2, 1);
    grid->addWidget(label, 0, hasIcon ? 2 : 1, 1, 1);
    if (informativeLabel) {
#ifndef Q_OS_MAC
        informativeLabel->setContentsMargins(0, 7, 0, 7);
#endif
        grid->addWidget(informativeLabel, 1, hasIcon ? 2 : 1, 1, 1);
    }
    if (checkbox) {
        grid->addWidget(checkbox, informativeLabel ? 2 : 1, hasIcon ? 2 : 1, 1, 1, Qt::AlignLeft);
#ifdef Q_OS_MAC
        grid->addItem(new QSpacerItem(1, 15, QSizePolicy::Fixed, QSizePolicy::Fixed), grid->rowCount(), 0);
#else
        grid->addItem(new QSpacerItem(1, 7, QSizePolicy::Fixed, QSizePolicy::Fixed), grid->rowCount(), 0);
#endif
    }
#ifdef Q_OS_MAC
    grid->addWidget(buttonBox, grid->rowCount(), hasIcon ? 2 : 1, 1, 1);
    grid->setContentsMargins(0, 0, 0, 0);
    grid->setVerticalSpacing(8);
    grid->setHorizontalSpacing(0);
    q->setContentsMargins(24, 15, 24, 20);
    grid->setRowStretch(1, 100);
    grid->setRowMinimumHeight(2, 6);
#else
    grid->addWidget(buttonBox, grid->rowCount(), 0, 1, grid->columnCount());
#endif
#if QT_CONFIG(textedit)
    if (detailsText)
        grid->addWidget(detailsText, grid->rowCount(), 0, 1, grid->columnCount());
#endif
    grid->setSizeConstraint(QLayout::SetNoConstraint);
    q->setLayout(grid);

    retranslateStrings();
    updateSize();
}